

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rock_sample.cpp
# Opt level: O3

double __thiscall
despot::RockSample::ObsProb(RockSample *this,OBS_TYPE obs,State *state,ACT_TYPE action)

{
  bool bVar1;
  undefined8 uVar2;
  double dVar3;
  
  if (action < 5) {
    if (obs == 2) {
      dVar3 = 1.0;
    }
    else {
      dVar3 = 0.0;
    }
  }
  else {
    dVar3 = 0.0;
    if (obs < 2) {
      uVar2 = BaseRockSample::GetRobPos(&this->super_BaseRockSample,state);
      dVar3 = (double)despot::Coord::EuclideanDistance
                                (uVar2,*(undefined8 *)
                                        ((this->super_BaseRockSample).rock_pos_.
                                         super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>
                                         ._M_impl.super__Vector_impl_data._M_start +
                                        (ulong)(action - 5U) * 8));
      dVar3 = exp2(-dVar3 / (this->super_BaseRockSample).half_efficiency_distance_);
      dVar3 = (dVar3 + 1.0) * 0.5;
      bVar1 = BaseRockSample::GetRock(&this->super_BaseRockSample,state,action - 5U);
      if (bVar1 != obs) {
        dVar3 = 1.0 - dVar3;
      }
    }
  }
  return dVar3;
}

Assistant:

double RockSample::ObsProb(OBS_TYPE obs, const State& state, ACT_TYPE action) const {
	if (action <= E_SAMPLE)
		return obs == E_NONE;

	if (obs != E_GOOD && obs != E_BAD)
		return 0;

	const RockSampleState& rockstate =
		static_cast<const RockSampleState&>(state);

	int rock = action - E_SAMPLE - 1;
	double distance = Coord::EuclideanDistance(GetRobPos(&rockstate),
		rock_pos_[rock]);
	double efficiency = (1 + pow(2, -distance / half_efficiency_distance_))
		* 0.5;

	return
		((GetRock(&rockstate, rock) & 1) == obs) ? efficiency : (1 - efficiency);
}